

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O0

void __thiscall ImplSimd<SimdSSE2>::RGB2YUV(ImplSimd<SimdSSE2> *this,RGB *rgb,YUV420 *yuv)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  longlong local_2f8 [2];
  longlong local_2e8 [2];
  longlong local_2d8 [2];
  longlong local_2c8 [2];
  longlong local_2b8 [2];
  longlong local_2a8 [2];
  longlong local_298 [2];
  longlong local_288 [2];
  longlong local_278 [2];
  longlong local_268 [2];
  longlong local_258 [2];
  longlong local_248 [2];
  longlong local_238 [2];
  longlong local_228 [2];
  longlong local_218 [2];
  longlong local_208 [2];
  longlong local_1f8 [2];
  longlong local_1e8 [2];
  longlong local_1d8 [2];
  longlong local_1c8 [2];
  longlong local_1b8 [2];
  longlong local_1a8 [2];
  longlong local_198 [2];
  longlong local_188 [2];
  longlong local_178 [2];
  longlong local_168 [2];
  longlong local_158 [2];
  longlong local_148 [2];
  longlong local_138 [2];
  longlong local_128 [2];
  longlong local_118 [2];
  longlong local_108 [2];
  longlong local_f8 [2];
  longlong local_e8 [2];
  longlong local_d8 [2];
  longlong local_c8 [2];
  longlong local_b8 [2];
  longlong local_a8 [2];
  longlong local_98 [2];
  longlong lStack_88;
  Vector e;
  Vector d;
  Vector c;
  size_t i;
  uint8_t *b;
  uint8_t *g;
  uint8_t *r;
  uint8_t *v;
  uint8_t *u;
  uint8_t *y;
  YUV420 *yuv_local;
  RGB *rgb_local;
  ImplSimd<SimdSSE2> *this_local;
  
  if (yuv->height_ != rgb->height_) {
    __assert_fail("yuv->height_ == rgb->height_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3d,
                  "virtual void ImplSimd<SimdSSE2>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdSSE2]");
  }
  if (yuv->width_ == rgb->width_) {
    if ((yuv->size_ & 7) == 0) {
      puVar1 = yuv->y_;
      puVar2 = yuv->u_;
      puVar3 = yuv->v_;
      puVar4 = rgb->r_;
      puVar5 = rgb->g_;
      puVar6 = rgb->b_;
      for (c[1] = 0; (ulong)c[1] < yuv->size_; c[1] = c[1] + 8) {
        SimdSSE2::Load(puVar4 + c[1]);
        SimdSSE2::Load(puVar5 + c[1]);
        SimdSSE2::Load(puVar6 + c[1]);
        SimdSSE2::Constant(0x42);
        SimdSSE2::Mul(&local_f8,(VectorType *)(d + 1));
        SimdSSE2::Constant(0x81);
        SimdSSE2::Mul(&local_118,(VectorType *)(e + 1));
        SimdSSE2::Add(&local_e8,&local_108);
        SimdSSE2::Constant(0x19);
        SimdSSE2::Mul(&local_138,(VectorType *)&lStack_88);
        SimdSSE2::Add(&local_d8,&local_128);
        SimdSSE2::Constant(0x80);
        SimdSSE2::Add(&local_c8,&local_148);
        SimdSSE2::Rli(&local_b8,8);
        SimdSSE2::Constant(0x10);
        SimdSSE2::Add(&local_a8,&local_158);
        SimdSSE2::Store(&local_98,puVar1 + c[1]);
        SimdSSE2::Constant(0x70);
        SimdSSE2::Mul(&local_1c8,(VectorType *)&lStack_88);
        SimdSSE2::Constant(0x26);
        SimdSSE2::Mul(&local_1e8,(VectorType *)(d + 1));
        SimdSSE2::Sub(&local_1b8,&local_1d8);
        SimdSSE2::Constant(0x4a);
        SimdSSE2::Mul(&local_208,(VectorType *)(e + 1));
        SimdSSE2::Sub(&local_1a8,&local_1f8);
        SimdSSE2::Constant(0x80);
        SimdSSE2::Add(&local_198,&local_218);
        SimdSSE2::Rli(&local_188,8);
        SimdSSE2::Constant(0x80);
        SimdSSE2::Add(&local_178,&local_228);
        SimdSSE2::Store(&local_168,puVar2 + c[1]);
        SimdSSE2::Constant(0x70);
        SimdSSE2::Mul(&local_298,(VectorType *)(d + 1));
        SimdSSE2::Constant(0x5e);
        SimdSSE2::Mul(&local_2b8,(VectorType *)(e + 1));
        SimdSSE2::Sub(&local_288,&local_2a8);
        SimdSSE2::Constant(0x12);
        SimdSSE2::Mul(&local_2d8,(VectorType *)&lStack_88);
        SimdSSE2::Sub(&local_278,&local_2c8);
        SimdSSE2::Constant(0x80);
        SimdSSE2::Add(&local_268,&local_2e8);
        SimdSSE2::Rli(&local_258,8);
        SimdSSE2::Constant(0x80);
        SimdSSE2::Add(&local_248,&local_2f8);
        SimdSSE2::Store(&local_238,puVar3 + c[1]);
        SimdSSE2::Empty();
      }
      return;
    }
    __assert_fail("yuv->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3f,
                  "virtual void ImplSimd<SimdSSE2>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdSSE2]");
  }
  __assert_fail("yuv->width_ == rgb->width_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x3e,"virtual void ImplSimd<SimdSSE2>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdSSE2]")
  ;
}

Assistant:

void ImplSimd<SIMD>::RGB2YUV(RGB *rgb, YUV420 *yuv) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);

    /*
    y[i] = clamp(((66 * c + 129 * d + 25 * e + 128) >> 8) + 16);
    u[i] = clamp(((-38 * c - 74 * d + 112 * e + 128) >> 8) + 128);
    v[i] = clamp(((112 * c - 94 * d - 18 * e + 128) >> 8) + 128);
     */
    store(add(rli(add(add(add(mul(cn(66),c), mul(cn(129), d)), mul(cn(25), e)), cn(128)),8), cn(16)), y+i);
    store(add(rli(add(sub(sub(mul(cn(112),e), mul(cn(38), c)), mul(cn(74), d)), cn(128)),8), cn(128)), u+i);
    store(add(rli(add(sub(sub(mul(cn(112),c), mul(cn(94), d)), mul(cn(18), e)), cn(128)),8), cn(128)), v+i);
    SIMD::Empty();
  }

}